

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O2

void qt_alphamapblit_argb32_oneline
               (uchar *map,int mapWidth,QRgba64 *srcColor,quint32 *dest,quint32 c,
               QColorTrcLut *colorProfile)

{
  byte bVar1;
  QRgba64 srcLinear;
  ulong uVar2;
  ulong uVar3;
  long in_FS_OFFSET;
  QRgb local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = 0;
  uVar3 = (ulong)(uint)mapWidth;
  if (mapWidth < 1) {
    uVar3 = uVar2;
  }
  for (; uVar3 != uVar2; uVar2 = uVar2 + 1) {
    bVar1 = map[uVar2];
    if (bVar1 != 0) {
      if (((colorProfile == (QColorTrcLut *)0x0) || (bVar1 == 0xff)) || (*dest < 0xff000000)) {
        blend_pixel(dest,c,(uint)bVar1);
      }
      else {
        if (c < 0xff000000) {
          local_3c = *dest;
          blend_pixel(&local_3c,c);
          srcLinear = QColorTrcLut::toLinear64(colorProfile,local_3c);
        }
        else {
          srcLinear = (QRgba64)srcColor->rgba;
        }
        grayBlendPixel(dest,(uint)bVar1,srcLinear,colorProfile);
      }
    }
    dest = dest + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void qt_alphamapblit_argb32_oneline(const uchar *map,
                                           int mapWidth, const QRgba64 &srcColor,
                                           quint32 *dest, const quint32 c,
                                           const QColorTrcLut *colorProfile)
{
    for (int i = 0; i < mapWidth; ++i)
        alphamapblend_argb32(dest + i, map[i], srcColor, c, colorProfile);
}